

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zfgmr.c
# Opt level: O3

int zfgmr(int n,_func_void_doublecomplex_doublecomplex_ptr_doublecomplex_doublecomplex_ptr *zmatvec,
         _func_void_int_doublecomplex_ptr_doublecomplex_ptr *zpsolve,doublecomplex *rhs,
         doublecomplex *sol,double tol,int im,int *itmax,FILE *fits)

{
  double *pdVar1;
  undefined8 *puVar2;
  integer *incx;
  double dVar3;
  doublecomplex *x;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  long *addr;
  doublecomplex *pdVar16;
  void *pvVar17;
  ulong uVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  double *pdVar22;
  long lVar23;
  size_t sVar24;
  doublecomplex *pdVar25;
  uint uVar26;
  double dVar27;
  int j;
  ulong uVar28;
  ulong uVar29;
  double *pdVar30;
  ulong uVar31;
  int iVar32;
  void *addr_00;
  doublereal dVar33;
  double dVar34;
  double dVar35;
  int i_2;
  int i_1;
  uint local_104;
  double local_100;
  ulong local_f8;
  void *local_f0;
  ulong local_e8;
  void *local_e0;
  doublecomplex *local_d8;
  ulong local_d0;
  ulong local_c8;
  double local_c0;
  doublecomplex *local_b8;
  doublecomplex *local_b0;
  doublecomplex local_a8;
  double local_90;
  _func_void_doublecomplex_doublecomplex_ptr_doublecomplex_doublecomplex_ptr *local_88;
  ulong local_80;
  uint local_74;
  uint local_70;
  int local_6c;
  integer local_68 [2];
  ulong local_60;
  doublecomplex *local_58;
  doublecomplex *local_50;
  ulong local_48;
  double *local_40;
  _func_void_int_doublecomplex_ptr_doublecomplex_ptr *local_38;
  
  local_c8 = (ulong)(uint)*itmax;
  local_68[1] = 1;
  local_68[0] = 2;
  uVar26 = im + 1;
  local_100 = (double)(long)(int)uVar26;
  local_104 = n;
  local_90 = tol;
  local_88 = zmatvec;
  local_58 = rhs;
  local_50 = sol;
  local_38 = zpsolve;
  addr = (long *)superlu_malloc((long)local_100 * 8);
  local_e8 = (ulong)(uint)im;
  if (-1 < im) {
    uVar28 = 0;
    do {
      pdVar16 = doublecomplexMalloc((long)n);
      addr[uVar28] = (long)pdVar16;
      uVar28 = uVar28 + 1;
    } while (uVar26 != uVar28);
  }
  uVar28 = local_e8;
  iVar19 = (int)local_e8;
  local_f8 = (ulong)iVar19;
  sVar24 = local_f8 * 8;
  local_74 = uVar26;
  pvVar17 = superlu_malloc(sVar24);
  local_f0 = superlu_malloc(sVar24);
  uVar28 = uVar28 & 0xffffffff;
  local_60 = uVar28;
  if (0 < iVar19) {
    sVar24 = 2;
    do {
      pdVar16 = doublecomplexMalloc(sVar24);
      *(doublecomplex **)((long)local_f0 + sVar24 * 8 + -0x10) = pdVar16;
      pdVar16 = doublecomplexMalloc((long)n);
      *(doublecomplex **)((long)pvVar17 + sVar24 * 8 + -0x10) = pdVar16;
      lVar20 = sVar24 - uVar28;
      sVar24 = sVar24 + 1;
    } while (lVar20 != 1);
  }
  uVar28 = local_f8;
  local_b0 = doublecomplexMalloc(local_f8);
  local_b8 = doublecomplexMalloc(uVar28);
  local_d8 = doublecomplexMalloc((size_t)local_100);
  local_70 = (int)local_c8 + 10;
  local_f8 = 0;
  local_48 = 0;
  if (0 < (int)local_e8) {
    local_48 = local_e8 & 0xffffffff;
  }
  local_40 = &local_d8[1].i;
  incx = local_68 + 1;
  local_c0 = 0.0;
  pdVar25 = local_50;
  pdVar16 = local_58;
  local_e0 = pvVar17;
  do {
    (*local_88)((doublecomplex)ZEXT816(0x3ff0000000000000),pdVar25,(doublecomplex)ZEXT816(0),
                (doublecomplex *)*addr);
    pdVar25 = (doublecomplex *)*addr;
    if (0 < (long)(int)local_104) {
      lVar20 = 0;
      do {
        pdVar30 = (double *)((long)&pdVar16->r + lVar20);
        pdVar22 = (double *)((long)&pdVar25->r + lVar20);
        dVar34 = pdVar30[1] - pdVar22[1];
        auVar5._8_4_ = SUB84(dVar34,0);
        auVar5._0_8_ = *pdVar30 - *pdVar22;
        auVar5._12_4_ = (int)((ulong)dVar34 >> 0x20);
        *(undefined1 (*) [16])((long)&pdVar25->r + lVar20) = auVar5;
        lVar20 = lVar20 + 0x10;
      } while ((long)(int)local_104 * 0x10 != lVar20);
    }
    local_100 = dznrm2_((integer *)&local_104,pdVar25,incx);
    if ((fits != (FILE *)0x0) && ((int)local_f8 == 0)) {
      fprintf((FILE *)fits,"%8d   %10.2e\n",SUB84(local_100,0),0);
    }
    dVar33 = dznrm2_((integer *)&local_104,pdVar16,incx);
    uVar28 = local_f8;
    if (local_100 <= dVar33 * local_90) goto LAB_00102dbd;
    if (0 < (long)(int)local_104) {
      lVar20 = *addr;
      lVar23 = 0;
      do {
        pdVar30 = (double *)(lVar20 + lVar23);
        dVar34 = pdVar30[1];
        pdVar22 = (double *)(lVar20 + lVar23);
        *pdVar22 = *pdVar30 * (1.0 / local_100);
        pdVar22[1] = dVar34 * (1.0 / local_100);
        lVar23 = lVar23 + 0x10;
      } while ((long)(int)local_104 * 0x10 != lVar23);
    }
    if ((int)local_f8 == 0) {
      local_c0 = local_100 * local_90;
    }
    local_d8->r = local_100;
    local_d8->i = 0.0;
    lVar20 = 1;
    uVar29 = 0;
    uVar28 = 0;
    do {
      uVar31 = uVar28;
      uVar18 = local_48;
      if (uVar31 == local_48) break;
      local_80 = uVar29;
      if (local_38 == (_func_void_int_doublecomplex_ptr_doublecomplex_ptr *)0x0) {
        zcopy_((integer *)&local_104,(doublecomplex *)addr[uVar31],incx,
               *(doublecomplex **)((long)local_e0 + uVar31 * 8),incx);
      }
      else {
        (*local_38)(local_104,*(doublecomplex **)((long)local_e0 + uVar31 * 8),
                    (doublecomplex *)addr[uVar31]);
      }
      local_f8 = (ulong)((int)local_f8 + 1);
      uVar28 = uVar31 + 1;
      (*local_88)((doublecomplex)ZEXT816(0x3ff0000000000000),
                  *(doublecomplex **)((long)local_e0 + uVar31 * 8),(doublecomplex)ZEXT816(0),
                  (doublecomplex *)addr[uVar28]);
      local_100 = dznrm2_((integer *)&local_104,(doublecomplex *)addr[uVar28],incx);
      lVar23 = 0;
      do {
        pdVar16 = (doublecomplex *)addr[lVar23];
        pdVar25 = (doublecomplex *)addr[uVar28];
        if ((long)(int)local_104 < 1) {
          dVar34 = 0.0;
          dVar35 = 0.0;
        }
        else {
          dVar34 = 0.0;
          dVar35 = 0.0;
          lVar21 = 0;
          do {
            pdVar30 = (double *)((long)&pdVar16->r + lVar21);
            dVar11 = *pdVar30;
            dVar12 = pdVar30[1];
            dVar3 = *(double *)((long)&pdVar25->r + lVar21);
            dVar27 = *(double *)((long)&pdVar25->i + lVar21);
            dVar34 = dVar34 + dVar3 * dVar11 + dVar27 * dVar12;
            dVar35 = dVar35 + dVar3 * -dVar12 + dVar27 * dVar11;
            lVar21 = lVar21 + 0x10;
          } while ((long)(int)local_104 * 0x10 != lVar21);
        }
        uVar26 = (uint)((ulong)dVar35 >> 0x20);
        auVar6._8_4_ = SUB84(dVar35,0);
        auVar6._0_8_ = dVar34;
        auVar6._12_4_ = uVar26;
        *(undefined1 (*) [16])(*(long *)((long)local_f0 + uVar31 * 8) + lVar23 * 0x10) = auVar6;
        local_a8.i._0_4_ = SUB84(dVar35,0);
        local_a8.r = -dVar34;
        local_a8.i._4_4_ = uVar26 ^ 0x80000000;
        zaxpy_((integer *)&local_104,&local_a8,pdVar16,incx,pdVar25,incx);
        lVar23 = lVar23 + 1;
      } while (lVar23 != lVar20);
      dVar33 = dznrm2_((integer *)&local_104,(doublecomplex *)addr[uVar28],incx);
      if (dVar33 < local_100 * 0.5) {
        do {
          lVar23 = 0;
          local_100 = dVar33;
          do {
            pdVar16 = (doublecomplex *)addr[lVar23];
            pdVar25 = (doublecomplex *)addr[uVar28];
            if ((long)(int)local_104 < 1) {
              dVar34 = 0.0;
              dVar35 = 0.0;
            }
            else {
              dVar34 = 0.0;
              dVar35 = 0.0;
              lVar21 = 0;
              do {
                pdVar30 = (double *)((long)&pdVar16->r + lVar21);
                dVar11 = *pdVar30;
                dVar12 = pdVar30[1];
                dVar3 = *(double *)((long)&pdVar25->r + lVar21);
                dVar27 = *(double *)((long)&pdVar25->i + lVar21);
                dVar34 = dVar34 + dVar3 * dVar11 + dVar27 * dVar12;
                dVar35 = dVar35 + dVar3 * -dVar12 + dVar27 * dVar11;
                lVar21 = lVar21 + 0x10;
              } while ((long)(int)local_104 * 0x10 != lVar21);
            }
            lVar21 = *(long *)((long)local_f0 + uVar31 * 8);
            pdVar30 = (double *)(lVar21 + lVar23 * 0x10);
            dVar3 = pdVar30[1];
            pdVar22 = (double *)(lVar21 + lVar23 * 0x10);
            *pdVar22 = *pdVar30 + dVar34;
            pdVar22[1] = dVar3 + dVar35;
            local_a8.i._0_4_ = SUB84(dVar35,0);
            local_a8.r = -dVar34;
            local_a8.i._4_4_ = (uint)((ulong)dVar35 >> 0x20) ^ 0x80000000;
            zaxpy_((integer *)&local_104,&local_a8,pdVar16,incx,pdVar25,incx);
            lVar23 = lVar23 + 1;
          } while (lVar23 != lVar20);
          dVar33 = dznrm2_((integer *)&local_104,(doublecomplex *)addr[uVar28],incx);
        } while (dVar33 < local_100 * 0.5);
      }
      uVar29 = local_80;
      pdVar30 = *(double **)((long)local_f0 + uVar31 * 8);
      local_100 = (double)(uVar28 * 0x10);
      pdVar30[uVar28 * 2] = dVar33;
      pdVar30[uVar28 * 2 + 1] = 0.0;
      if (((dVar33 != 0.0) || (NAN(dVar33))) && (0 < (long)(int)local_104)) {
        lVar23 = addr[uVar28];
        lVar21 = 0;
        do {
          pdVar22 = (double *)(lVar23 + lVar21);
          dVar34 = pdVar22[1];
          pdVar1 = (double *)(lVar23 + lVar21);
          *pdVar1 = *pdVar22 * (1.0 / dVar33);
          pdVar1[1] = dVar34 * (1.0 / dVar33);
          lVar21 = lVar21 + 0x10;
        } while ((long)(int)local_104 * 0x10 != lVar21);
      }
      if (uVar31 != 0) {
        dVar34 = *pdVar30;
        dVar35 = pdVar30[1];
        uVar18 = 0;
        do {
          pdVar22 = (double *)((long)&local_b0->r + uVar18);
          dVar11 = *pdVar22;
          dVar12 = pdVar22[1];
          pdVar22 = (double *)((long)&local_b8->r + uVar18);
          dVar13 = *pdVar22;
          dVar14 = pdVar22[1];
          dVar3 = *(double *)((long)pdVar30 + uVar18 + 0x10);
          dVar27 = *(double *)((long)pdVar30 + uVar18 + 0x18);
          *(double *)((long)pdVar30 + uVar18) =
               dVar13 * dVar3 + -dVar14 * dVar27 + dVar11 * dVar34 + -dVar12 * dVar35;
          ((double *)((long)pdVar30 + uVar18))[1] =
               dVar14 * dVar3 + dVar13 * dVar27 + dVar12 * dVar34 + dVar11 * dVar35;
          pdVar22 = (double *)((long)&local_b8->r + uVar18);
          dVar12 = *pdVar22;
          dVar13 = pdVar22[1];
          dVar11 = dVar34 * dVar13;
          pdVar22 = (double *)((long)&local_b0->r + uVar18);
          dVar14 = *pdVar22;
          dVar15 = pdVar22[1];
          dVar34 = (dVar3 * dVar14 + -dVar15 * dVar27) - (dVar34 * dVar12 + -dVar13 * dVar35);
          dVar35 = (dVar3 * dVar15 + dVar14 * dVar27) - (dVar11 + dVar12 * dVar35);
          pdVar22 = (double *)((long)pdVar30 + uVar18 + 0x10);
          *pdVar22 = dVar34;
          pdVar22[1] = dVar35;
          uVar18 = uVar18 + 0x10;
        } while (local_80 != uVar18);
      }
      local_d0 = uVar31 * 0x10;
      dVar33 = dznrm2_(local_68,(doublecomplex *)(pdVar30 + uVar31 * 2),incx);
      if ((dVar33 != 0.0) || (NAN(dVar33))) {
        dVar35 = 1.0 / dVar33;
        lVar23 = *(long *)((long)local_f0 + uVar31 * 8);
        dVar34 = ((double *)(lVar23 + local_d0))[1] * dVar35;
        auVar9._8_4_ = SUB84(dVar34,0);
        auVar9._0_8_ = *(double *)(lVar23 + local_d0) * dVar35;
        auVar9._12_4_ = (int)((ulong)dVar34 >> 0x20);
        *(undefined1 (*) [16])((long)&local_b0->r + local_d0) = auVar9;
        dVar34 = *(double *)(lVar23 + (long)local_100) * dVar35;
        dVar35 = ((double *)(lVar23 + (long)local_100))[1] * dVar35;
        auVar10._8_4_ = SUB84(dVar35,0);
        auVar10._0_8_ = dVar34;
        auVar10._12_4_ = (int)((ulong)dVar35 >> 0x20);
        *(undefined1 (*) [16])((long)&local_b8->r + local_d0) = auVar10;
      }
      else {
        puVar2 = (undefined8 *)((long)&local_b0->r + local_d0);
        *puVar2 = 0x3ff0000000000000;
        puVar2[1] = 0;
        dVar34 = 0.0;
        dVar35 = 0.0;
        puVar2 = (undefined8 *)((long)&local_b8->r + local_d0);
        *puVar2 = 0;
        puVar2[1] = 0;
        lVar23 = *(long *)((long)local_f0 + uVar31 * 8);
      }
      dVar3 = *(double *)((long)&local_d8->r + local_d0);
      dVar27 = *(double *)((long)&local_d8->i + local_d0);
      dVar11 = dVar35 * dVar3 + dVar34 * dVar27;
      auVar7._8_4_ = SUB84(dVar11,0);
      auVar7._0_8_ = -(dVar34 * dVar3 + -dVar35 * dVar27);
      auVar7._12_4_ = (uint)((ulong)dVar11 >> 0x20) ^ 0x80000000;
      *(undefined1 (*) [16])((long)&local_d8->r + (long)local_100) = auVar7;
      pdVar30 = (double *)((long)&local_b0->r + local_d0);
      dVar34 = *pdVar30;
      dVar35 = pdVar30[1];
      pdVar30 = (double *)((long)&local_d8->r + local_d0);
      *pdVar30 = dVar3 * dVar34 + -dVar35 * dVar27;
      pdVar30[1] = dVar3 * dVar35 + dVar34 * dVar27;
      pdVar30 = (double *)((long)&local_b0->r + local_d0);
      dVar11 = *pdVar30;
      dVar12 = pdVar30[1];
      dVar34 = *(double *)(lVar23 + local_d0);
      dVar35 = *(double *)(lVar23 + 8 + local_d0);
      pdVar30 = (double *)((long)&local_b8->r + local_d0);
      dVar13 = *pdVar30;
      dVar14 = pdVar30[1];
      dVar3 = *(double *)(lVar23 + (long)local_100);
      dVar27 = *(double *)(lVar23 + 8 + (long)local_100);
      *(double *)(lVar23 + local_d0) =
           dVar3 * dVar13 + -dVar14 * dVar27 + dVar34 * dVar11 + -dVar12 * dVar35;
      ((double *)(lVar23 + local_d0))[1] =
           dVar3 * dVar14 + dVar13 * dVar27 + dVar34 * dVar12 + dVar11 * dVar35;
      dVar34 = z_abs1((doublecomplex *)((long)&local_d8->r + (long)local_100));
      if (fits != (FILE *)0x0) {
        local_100 = dVar34;
        fprintf((FILE *)fits,"%8d   %10.2e\n",SUB84(dVar34,0),local_f8);
        dVar34 = local_100;
      }
      uVar18 = uVar31;
      if (dVar34 <= local_c0) break;
      lVar20 = lVar20 + 1;
      uVar29 = uVar29 + 0x10;
    } while ((int)local_f8 < (int)local_c8);
    iVar32 = (int)uVar18;
    iVar19 = iVar32 - (uint)(iVar32 == (int)local_e8);
    local_d0 = (ulong)-(uint)(iVar32 == (int)local_e8);
    lVar20 = (long)iVar19;
    local_6c = iVar19;
    z_div(local_d8 + lVar20,local_d8 + lVar20,
          (doublecomplex *)(lVar20 * 0x10 + *(long *)((long)local_f0 + lVar20 * 8)));
    if (0 < iVar19) {
      dVar34 = (double)((uVar18 & 0xffffffff) + ~(ulong)(iVar32 == (int)local_e8));
      local_80 = (ulong)((int)local_d0 + iVar32 + 1);
      pdVar30 = local_40 + (long)dVar34 * 2;
      uVar28 = 1;
      do {
        lVar23 = lVar20 - uVar28;
        dVar35 = local_d8[lVar23].r;
        dVar3 = local_d8[lVar23].i;
        pdVar22 = pdVar30;
        dVar27 = dVar34;
        do {
          lVar21 = (long)dVar27 * 8;
          dVar27 = (double)((long)dVar27 + 1);
          pdVar1 = (double *)(*(long *)((long)local_f0 + lVar21 + 8) + lVar23 * 0x10);
          dVar11 = *pdVar1;
          dVar12 = pdVar1[1];
          dVar35 = dVar35 - (((doublecomplex *)(pdVar22 + -1))->r * dVar11 + -dVar12 * *pdVar22);
          dVar3 = dVar3 - (((doublecomplex *)(pdVar22 + -1))->r * dVar12 + dVar11 * *pdVar22);
          local_a8.i._0_4_ = SUB84(dVar3,0);
          local_a8.r = dVar35;
          local_a8.i._4_4_ = (int)((ulong)dVar3 >> 0x20);
          pdVar22 = pdVar22 + 2;
        } while ((long)dVar27 < lVar20);
        local_100 = dVar34;
        z_div(local_d8 + lVar23,&local_a8,
              (doublecomplex *)(lVar23 * 0x10 + *(long *)((long)local_f0 + lVar23 * 8)));
        uVar28 = uVar28 + 1;
        dVar34 = (double)((long)local_100 + -1);
        pdVar30 = pdVar30 + -2;
      } while (uVar28 != local_80);
    }
    pdVar25 = local_50;
    if (-1 < local_6c) {
      uVar28 = 0;
      do {
        if (0 < (int)local_104) {
          dVar34 = local_d8[uVar28].r;
          dVar35 = local_d8[uVar28].i;
          lVar20 = *(long *)((long)local_e0 + uVar28 * 8);
          lVar23 = 0;
          do {
            dVar3 = *(double *)(lVar20 + lVar23);
            dVar27 = *(double *)(lVar20 + 8 + lVar23);
            pdVar30 = (double *)((long)&local_50->r + lVar23);
            dVar11 = pdVar30[1];
            pdVar22 = (double *)((long)&local_50->r + lVar23);
            *pdVar22 = *pdVar30 + dVar3 * dVar34 + dVar27 * -dVar35;
            pdVar22[1] = dVar11 + dVar3 * dVar35 + dVar27 * dVar34;
            lVar23 = lVar23 + 0x10;
          } while ((ulong)local_104 << 4 != lVar23);
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 != (int)local_d0 + iVar32 + 1);
    }
    (*local_88)((doublecomplex)ZEXT816(0x3ff0000000000000),local_50,(doublecomplex)ZEXT816(0),
                (doublecomplex *)*addr);
    pdVar16 = local_58;
    x = (doublecomplex *)*addr;
    if (0 < (long)(int)local_104) {
      lVar20 = 0;
      do {
        pdVar30 = (double *)((long)&local_58->r + lVar20);
        pdVar22 = (double *)((long)&x->r + lVar20);
        dVar34 = pdVar30[1] - pdVar22[1];
        auVar8._8_4_ = SUB84(dVar34,0);
        auVar8._0_8_ = *pdVar30 - *pdVar22;
        auVar8._12_4_ = (int)((ulong)dVar34 >> 0x20);
        *(undefined1 (*) [16])((long)&x->r + lVar20) = auVar8;
        lVar20 = lVar20 + 0x10;
      } while ((long)(int)local_104 * 0x10 != lVar20);
    }
    dVar33 = dznrm2_((integer *)&local_104,x,incx);
    uVar28 = local_f8 & 0xffffffff;
    if (local_c0 / local_90 <= dVar33) {
      uVar28 = (ulong)local_70;
LAB_00102dbd:
      local_f8 = uVar28;
      if ((int)local_e8 < 0) {
        superlu_free(addr);
        addr_00 = local_e0;
        pvVar17 = local_f0;
      }
      else {
        uVar28 = (ulong)local_74;
        uVar29 = 0;
        do {
          superlu_free((void *)addr[uVar29]);
          uVar29 = uVar29 + 1;
        } while (uVar28 != uVar29);
        superlu_free(addr);
        uVar28 = local_60;
        addr_00 = local_e0;
        pvVar17 = local_f0;
        if (0 < (int)local_e8) {
          uVar29 = 0;
          do {
            superlu_free(*(void **)((long)pvVar17 + uVar29 * 8));
            superlu_free(*(void **)((long)addr_00 + uVar29 * 8));
            uVar29 = uVar29 + 1;
          } while (uVar28 != uVar29);
        }
      }
      iVar19 = (int)local_f8;
      bVar4 = (int)local_c8 <= iVar19;
      superlu_free(pvVar17);
      superlu_free(addr_00);
      superlu_free(local_b0);
      superlu_free(local_b8);
      superlu_free(local_d8);
      *itmax = iVar19;
      return (int)bVar4;
    }
    if ((dVar33 <= local_c0) || (iVar19 = (int)local_f8, local_f8 = uVar28, (int)local_c8 <= iVar19)
       ) goto LAB_00102dbd;
  } while( true );
}

Assistant:

int zfgmr(int n,
     void (*zmatvec) (doublecomplex, doublecomplex[], doublecomplex, doublecomplex[]),
     void (*zpsolve) (int, doublecomplex[], doublecomplex[]),
     doublecomplex *rhs, doublecomplex *sol, double tol, int im, int *itmax, FILE * fits)
{
/*----------------------------------------------------------------------
|                 *** Preconditioned FGMRES ***
+-----------------------------------------------------------------------
| This is a simple version of the ARMS preconditioned FGMRES algorithm.
+-----------------------------------------------------------------------
| Y. S. Dec. 2000. -- Apr. 2008
+-----------------------------------------------------------------------
| on entry:
|----------
|
| rhs     = real vector of length n containing the right hand side.
| sol     = real vector of length n containing an initial guess to the
|           solution on input.
| tol     = tolerance for stopping iteration
| im      = Krylov subspace dimension
| (itmax) = max number of iterations allowed.
| fits    = NULL: no output
|        != NULL: file handle to output " resid vs time and its"
|
| on return:
|----------
| fgmr      int =  0 --> successful return.
|           int =  1 --> convergence not achieved in itmax iterations.
| sol     = contains an approximate solution (upon successful return).
| itmax   = has changed. It now contains the number of steps required
|           to converge --
+-----------------------------------------------------------------------
| internal work arrays:
|----------
| vv      = work array of length [im+1][n] (used to store the Arnoldi
|           basis)
| hh      = work array of length [im][im+1] (Householder matrix)
| z       = work array of length [im][n] to store preconditioned vectors
+-----------------------------------------------------------------------
| subroutines called :
| matvec - matrix-vector multiplication operation
| psolve - (right) preconditioning operation
|	   psolve can be a NULL pointer (GMRES without preconditioner)
+---------------------------------------------------------------------*/

    int maxits = *itmax;
    int its, i_1 = 1, i_2 = 2;
    double eps1 = 0.0;
    doublecomplex **hh, *c, *s, *rs;
    doublecomplex **vv, **z;
    doublecomplex zero = {0.0, 0.0};
    doublecomplex one = {1.0, 0.0};
    doublecomplex tt1, tt2;

    its = 0;
    vv = (doublecomplex **)SUPERLU_MALLOC((im + 1) * sizeof(doublecomplex *));
    for (int i = 0; i <= im; i++) vv[i] = doublecomplexMalloc(n);
    z = (doublecomplex **)SUPERLU_MALLOC(im * sizeof(doublecomplex *));
    hh = (doublecomplex **)SUPERLU_MALLOC(im * sizeof(doublecomplex *));
    for (int i = 0; i < im; i++)
    {
	hh[i] = doublecomplexMalloc(i + 2);
	z[i] = doublecomplexMalloc(n);
    }
    c = doublecomplexMalloc(im);
    s = doublecomplexMalloc(im);
    rs = doublecomplexMalloc(im + 1);

    /*---- outer loop starts here ----*/
    do
    {
	/*---- compute initial residual vector ----*/
	zmatvec(one, sol, zero, vv[0]);
	for (int j = 0; j < n; j++)
	    z_sub(&vv[0][j], &rhs[j], &vv[0][j]);	/* vv[0]= initial residual */
	double beta = dznrm2_(&n, vv[0], &i_1);

	/*---- print info if fits != null ----*/
	if (fits != NULL && its == 0)
	    fprintf(fits, "%8d   %10.2e\n", its, beta);
	/*if ( beta <= tol * dnrm2_(&n, rhs, &i_1) )*/
	if ( !(beta > tol * dznrm2_(&n, rhs, &i_1)) )
	    break;
	double t = 1.0 / beta;

	/*---- normalize: vv[0] = vv[0] / beta ----*/
	for (int j = 0; j < n; j++)
	    zd_mult(&vv[0][j], &vv[0][j], t);
	if (its == 0)
	    eps1 = tol * beta;

	/*---- initialize 1-st term of rhs of hessenberg system ----*/
	rs[0].r = beta;
	rs[0].i = 0.0;
	int i = 0;
	for (i = 0; i < im; i++)
	{
	    its++;
	    int i1 = i + 1;

	    /*------------------------------------------------------------
	    |  (Right) Preconditioning Operation   z_{j} = M^{-1} v_{j}
	    +-----------------------------------------------------------*/
	    if (zpsolve)
		zpsolve(n, z[i], vv[i]);
	    else
		zcopy_(&n, vv[i], &i_1, z[i], &i_1);

	    /*---- matvec operation w = A z_{j} = A M^{-1} v_{j} ----*/
	    zmatvec(one, z[i], zero, vv[i1]);

	    /*------------------------------------------------------------
	    |     modified gram - schmidt...
	    |     h_{i,j} = (w,v_{i})
	    |     w  = w - h_{i,j} v_{i}
	    +------------------------------------------------------------*/
	    double t0 = dznrm2_(&n, vv[i1], &i_1);
	    for (int j = 0; j <= i; j++)
	    {
		doublecomplex negt;
#if 0
		zdotc_(&tt, &n, vv[j], &i_1, vv[i1], &i_1);
#else
		doublecomplex tt = zero;
		for (int k = 0; k < n; ++k) {
		    zz_conj(&tt1, &vv[j][k]);
		    zz_mult(&tt2, &tt1, &vv[i1][k]);
		    z_add(&tt, &tt, &tt2);
		}
#endif
		hh[i][j] = tt;
		negt.r = -tt.r;
		negt.i = -tt.i;
		zaxpy_(&n, &negt, vv[j], &i_1, vv[i1], &i_1);
	    }

	    /*---- h_{j+1,j} = ||w||_{2} ----*/
	    t = dznrm2_(&n, vv[i1], &i_1);
	    while (t < 0.5 * t0)
	    {
		t0 = t;
		for (int j = 0; j <= i; j++)
		{
		    doublecomplex negt;
#if 0
		    zdotc_(&tt, &n, vv[j], &i_1, vv[i1], &i_1);
#else
   	            doublecomplex tt = zero;
		    for (int k = 0; k < n; ++k) {
		        zz_conj(&tt1, &vv[j][k]);
		        zz_mult(&tt2, &tt1, &vv[i1][k]);
		        z_add(&tt, &tt, &tt2);
		    }
#endif
		    z_add(&hh[i][j], &hh[i][j], &tt);
		    negt.r = -tt.r;
		    negt.i = -tt.i;
		    zaxpy_(&n, &negt, vv[j], &i_1, vv[i1], &i_1);
		}
		t = dznrm2_(&n, vv[i1], &i_1);
	    }

	    hh[i][i1].r = t;
	    hh[i][i1].i = 0.0;

	    if (t != 0.0)
	    {
		/*---- v_{j+1} = w / h_{j+1,j} ----*/
		t = 1.0 / t;
		for (int k = 0; k < n; k++)
	            zd_mult(&vv[i1][k], &vv[i1][k], t);
	    }
	    /*---------------------------------------------------
	    |     done with modified gram schmidt and arnoldi step
	    |     now  update factorization of hh
	    +--------------------------------------------------*/

	    /*--------------------------------------------------------
	    |   perform previous transformations  on i-th column of h
	    +-------------------------------------------------------*/
	    for (int k = 1; k <= i; k++)
	    {
		int k1 = k - 1;
		doublecomplex tt = hh[i][k1];
                zz_mult(&tt1, &c[k1], &tt);
                zz_mult(&tt2, &s[k1], &hh[i][k]);
                z_add(&hh[i][k1], &tt1, &tt2);

                zz_mult(&tt1, &s[k1], &tt);
                zz_mult(&tt2, &c[k1], &hh[i][k]);
                z_sub(&hh[i][k], &tt2, &tt1);
	    }

	    double gam = dznrm2_(&i_2, &hh[i][i], &i_1);

	    /*---------------------------------------------------
	    |     if gamma is zero then any small value will do
	    |     affect only residual estimate
	    +--------------------------------------------------*/
	    /* if (gam == 0.0) gam = epsmac; */

	    /*---- get next plane rotation ---*/
	    if (gam == 0.0)
	    {
		c[i] = one;
		s[i] = zero;
	    }
            else
	    {
                gam = 1.0 / gam;
		zd_mult(&c[i], &hh[i][i], gam);
		zd_mult(&s[i], &hh[i][i1], gam);
	    }

	    zz_mult(&rs[i1], &s[i], &rs[i]);
            rs[i1].r = -rs[i1].r;  rs[i1].i = -rs[i1].i;
	    zz_mult(&rs[i], &c[i], &rs[i]);

	    /*----------------------------------------------------
	    |   determine residual norm and test for convergence
	    +---------------------------------------------------*/
            zz_mult(&tt1, &c[i], &hh[i][i]);
            zz_mult(&tt2, &s[i], &hh[i][i1]);
            z_add(&hh[i][i], &tt1, &tt2);
            beta = z_abs1(&rs[i1]);
	    if (fits != NULL)
		fprintf(fits, "%8d   %10.2e\n", its, beta);
	    if (beta <= eps1 || its >= maxits)
		break;
	}

	if (i == im) i--;

	/*---- now compute solution. 1st, solve upper triangular system ----*/
	z_div(&rs[i], &rs[i], &hh[i][i]);

	for (int ii = 1; ii <= i; ii++)
	{
	    int k = i - ii;
	    doublecomplex tt = rs[k];
	    for (int j = k + 1; j <= i; j++) {
                zz_mult(&tt1, &hh[j][k], &rs[j]);
		z_sub(&tt, &tt, &tt1);
            }
            z_div(&rs[k], &tt, &hh[k][k]);
	}

	/*---- linear combination of v[i]'s to get sol. ----*/
	for (int j = 0; j <= i; j++)
	{
	    doublecomplex tt = rs[j];
	    for (int k = 0; k < n; k++) {
                zz_mult(&tt1, &tt, &z[j][k]);
		z_add(&sol[k], &sol[k], &tt1);
            }
	}

	/* calculate the residual and output */
	zmatvec(one, sol, zero, vv[0]);
	for (int j = 0; j < n; j++)
	    z_sub(&vv[0][j], &rhs[j], &vv[0][j]);/* vv[0]= initial residual */

	/*---- print info if fits != null ----*/
	beta = dznrm2_(&n, vv[0], &i_1);

	/*---- restart outer loop if needed ----*/
	/*if (beta >= eps1 / tol)*/
	if ( !(beta < eps1 / tol) )
	{
	    its = maxits + 10;
	    break;
	}
	if (beta <= eps1)
	    break;
    } while(its < maxits);

    int retval = (its >= maxits);
    for (int i = 0; i <= im; i++)
	SUPERLU_FREE(vv[i]);
    SUPERLU_FREE(vv);
    for (int i = 0; i < im; i++)
    {
	SUPERLU_FREE(hh[i]);
	SUPERLU_FREE(z[i]);
    }
    SUPERLU_FREE(hh);
    SUPERLU_FREE(z);
    SUPERLU_FREE(c);
    SUPERLU_FREE(s);
    SUPERLU_FREE(rs);

    *itmax = its;

    return retval;
}